

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::EncodeMaterial(ObjEncoder *this,FaceIndex face_id)

{
  PointAttribute *this_00;
  bool bVar1;
  uint in_EAX;
  iterator iVar2;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> att_index;
  ulong uStack_18;
  int material_id;
  
  uStack_18 = (ulong)in_EAX;
  this_00 = this->material_att_;
  att_index.value_ =
       (this->in_mesh_->faces_).vector_.
       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start[face_id.value_]._M_elems[0].value_;
  if (this_00->identity_mapping_ == false) {
    att_index.value_ =
         (this_00->indices_map_).vector_.
         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[att_index.value_].value_;
  }
  bVar1 = GeometryAttribute::ConvertValue<int>
                    (&this_00->super_GeometryAttribute,(AttributeValueIndex)att_index.value_,
                     &material_id);
  if (bVar1) {
    if (material_id == this->current_material_id_) {
      return true;
    }
    EncoderBuffer::Encode(this->out_buffer_,"usemtl ",7);
    iVar2 = std::
            _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->material_id_to_name_)._M_h,&material_id);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      EncoderBuffer::Encode
                (this->out_buffer_,
                 *(void **)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                  ._M_cur + 0x10),
                 *(size_t *)
                  ((long)iVar2.
                         super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                         ._M_cur + 0x18));
      EncoderBuffer::Encode(this->out_buffer_,"\n",1);
      this->current_material_id_ = material_id;
      return true;
    }
  }
  return false;
}

Assistant:

bool ObjEncoder::EncodeMaterial(FaceIndex face_id) {
  int material_id = 0;
  // Pick the first corner, all corners of a face should have same id.
  const PointIndex vert_index = in_mesh_->face(face_id)[0];
  const AttributeValueIndex index_id(material_att_->mapped_index(vert_index));
  if (!material_att_->ConvertValue<int>(index_id, &material_id)) {
    return false;
  }

  if (material_id != current_material_id_) {
    // Update material information.
    buffer()->Encode("usemtl ", 7);
    const auto mat_ptr = material_id_to_name_.find(material_id);
    // If the material id is not found.
    if (mat_ptr == material_id_to_name_.end()) {
      return false;
    }
    buffer()->Encode(mat_ptr->second.c_str(), mat_ptr->second.size());
    buffer()->Encode("\n", 1);
    current_material_id_ = material_id;
  }
  return true;
}